

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::skipNonNullCast
          (OptimizeInstructions *this,Expression **input,Expression *parent)

{
  EffectAnalyzer *this_00;
  PassRunner *pPVar1;
  Expression *ast;
  bool bVar2;
  bool bVar3;
  Expression **ppEVar4;
  byte bVar5;
  Iterator IVar6;
  undefined1 local_328 [8];
  ShallowEffectAnalyzer movingEffects;
  EffectAnalyzer crossedEffects;
  Iterator local_40;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*input;
  bVar2 = false;
  this_00 = (EffectAnalyzer *)
            &movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
             _M_node_count;
  do {
    if ((((Expression *)
         crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->_id !=
         RefAsId) ||
       (*(int *)(crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                0x10) != 0)) {
      return;
    }
    bVar3 = !bVar2;
    bVar2 = true;
    if (bVar3) {
      movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
      _M_node_count._1_1_ = (pPVar1->options).trapsNeverHappen;
      if ((bool)movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.
                super__Rb_tree_header._M_node_count._1_1_ == false) {
        crossedEffects._0_8_ =
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
        movingEffects.super_EffectAnalyzer.delegateTargets._M_t._M_impl.super__Rb_tree_header.
        _M_node_count._0_1_ = (pPVar1->options).ignoreImplicitTraps;
        crossedEffects.module._0_4_ = (((Module *)crossedEffects._0_8_)->features).features;
        crossedEffects.module._4_2_ = 0;
        crossedEffects.localsRead._M_t._M_impl._0_4_ = 0;
        crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.localsRead;
        crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.localsWritten._M_t._M_impl._0_4_ = 0;
        crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.localsWritten;
        crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
        crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.mutableGlobalsRead;
        crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.globalsWritten;
        crossedEffects.breakTargets._M_t._M_impl._0_4_ = 0;
        crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        crossedEffects.readsMemory = false;
        crossedEffects.writesMemory = false;
        crossedEffects.readsTable = false;
        crossedEffects.writesTable = false;
        crossedEffects.trap = false;
        crossedEffects.implicitTrap = false;
        crossedEffects.isAtomic = false;
        crossedEffects.throws_ = false;
        crossedEffects._228_4_ = 0;
        crossedEffects.tryDepth._0_7_ = 0;
        crossedEffects._239_4_ = 0;
        crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.breakTargets;
        crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
        crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&crossedEffects.delegateTargets;
        crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
        crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)local_328,parent);
        local_40.index = 0;
        local_40.parent = (AbstractChildIterator<wasm::ChildIterator> *)local_328;
        IVar6 = AbstractChildIterator<wasm::ChildIterator>::end
                          ((AbstractChildIterator<wasm::ChildIterator> *)local_328);
        bVar5 = 0;
        while ((local_40.index != IVar6.index || (local_40.parent != IVar6.parent))) {
          ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_40);
          ast = *ppEVar4;
          if ((bool)(~bVar5 & 1 | ast == *input)) {
            bVar5 = bVar5 | ast == *input;
          }
          else {
            EffectAnalyzer::walk(this_00,ast);
          }
          local_40.index = local_40.index + 1;
        }
        std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                   &movingEffects.super_EffectAnalyzer.localsRead._M_t._M_impl.super__Rb_tree_header
                  );
        ShallowEffectAnalyzer::ShallowEffectAnalyzer
                  ((ShallowEffectAnalyzer *)local_328,&pPVar1->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,*input);
        bVar3 = EffectAnalyzer::invalidates(this_00,(EffectAnalyzer *)local_328);
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_328);
        EffectAnalyzer::~EffectAnalyzer(this_00);
        bVar2 = true;
        if (bVar3) {
          return;
        }
      }
      else {
        bVar2 = false;
      }
    }
    crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (((Expression *)
          (crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10))
         ->type).id;
    *input = (Expression *)
             crossedEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  } while( true );
}

Assistant:

void skipNonNullCast(Expression*& input, Expression* parent) {
    // Check the other children for the ordering problem only if we find a
    // possible optimization, to avoid wasted work.
    bool checkedSiblings = false;
    auto& options = getPassOptions();
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (as->op == RefAsNonNull) {
          // The problem with effect ordering that is described above is not an
          // issue if traps are assumed to never happen anyhow.
          if (!checkedSiblings && !options.trapsNeverHappen) {
            // We need to see if a child with side effects exists after |input|.
            // If there is such a child, it is a problem as mentioned above (it
            // is fine for such a child to appear *before* |input|, as then we
            // wouldn't be reordering effects). Thus, all we need to do is
            // accumulate the effects in children after |input|, as we want to
            // move the trap across those.
            bool seenInput = false;
            EffectAnalyzer crossedEffects(options, *getModule());
            for (auto* child : ChildIterator(parent)) {
              if (child == input) {
                seenInput = true;
              } else if (seenInput) {
                crossedEffects.walk(child);
              }
            }

            // Check if the effects we cross interfere with the effects of the
            // trap we want to move. (We use a shallow effect analyzer since we
            // will only move the ref.as_non_null itself.)
            ShallowEffectAnalyzer movingEffects(options, *getModule(), input);
            if (crossedEffects.invalidates(movingEffects)) {
              return;
            }

            // If we got here, we've checked the siblings and found no problem.
            checkedSiblings = true;
          }
          input = as->value;
          continue;
        }
      }
      break;
    }
  }